

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O3

boolean encode_mcu_AC_refine(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  jpeg_entropy_encoder *pjVar2;
  JBLOCKROW paJVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  jpeg_entropy_encoder *pjVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  int *piVar13;
  _func_void_j_compress_ptr *p_Var14;
  uint local_54;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    uVar6 = *(uint *)&pjVar2[4].start_pass;
    if (uVar6 == 0) {
      emit_restart(cinfo,*(int *)((long)&pjVar2[4].start_pass + 4));
      uVar6 = cinfo->restart_interval;
      *(uint *)((long)&pjVar2[4].start_pass + 4) =
           *(int *)((long)&pjVar2[4].start_pass + 4) + 1U & 7;
    }
    *(uint *)&pjVar2[4].start_pass = uVar6 - 1;
  }
  paJVar3 = *MCU_data;
  uVar6 = cinfo->Se;
  uVar10 = (ulong)uVar6;
  uVar5 = (long)(int)uVar6;
  local_54 = uVar6;
  if (0 < (long)(int)uVar6) {
    do {
      uVar10 = uVar5;
      uVar9 = (uint)(*paJVar3)[jpeg_natural_order[uVar10]];
      if ((*paJVar3)[jpeg_natural_order[uVar10]] < 0) {
        uVar9 = -uVar9;
      }
      if (uVar9 >> ((byte)cinfo->Al & 0x1f) != 0) {
        local_54 = (uint)uVar10;
        if ((long)uVar10 < 1) goto LAB_001118c7;
        lVar12 = (uVar10 & 0xffffffff) + 1;
        goto LAB_0011188a;
      }
      uVar5 = uVar10 - 1;
    } while (1 < (long)uVar10);
    uVar10 = 0;
    goto LAB_001118b8;
  }
  goto LAB_001118c7;
LAB_00111978:
  if (uVar9 == 1) {
    arith_encode(cinfo,(uchar *)p_Var14,1);
    uVar9 = 0;
  }
  else {
LAB_001119c0:
    uVar9 = uVar9 & 1;
    pjVar8 = (jpeg_entropy_encoder *)(p_Var14 + 1);
  }
LAB_001119cc:
  arith_encode(cinfo,(uchar *)pjVar8,uVar9);
  iVar7 = iVar11 + 1;
  if ((int)uVar10 <= iVar11) goto code_r0x001119e9;
  goto LAB_001118f5;
code_r0x001119e9:
  uVar6 = cinfo->Se;
  iVar7 = iVar11 + 1;
  goto LAB_001119f5;
  while( true ) {
    local_54 = local_54 - 1;
    lVar12 = lVar12 + -1;
    if (lVar12 < 2) break;
LAB_0011188a:
    uVar9 = (uint)(*paJVar3)[*(int *)(&DAT_0014bfec + lVar12 * 4)];
    if ((*paJVar3)[*(int *)(&DAT_0014bfec + lVar12 * 4)] < 0) {
      uVar9 = -uVar9;
    }
    if (uVar9 >> ((byte)cinfo->Ah & 0x1f) != 0) goto LAB_001118c7;
  }
LAB_001118b8:
  local_54 = 0;
LAB_001118c7:
  iVar1 = cinfo->cur_comp_info[0]->ac_tbl_no;
  iVar7 = cinfo->Ss;
  if (iVar7 <= (int)uVar10) {
LAB_001118f5:
    p_Var14 = (&pjVar2[9].finish_pass)[iVar1];
    lVar12 = (long)(iVar7 * 3 + -3);
    if ((int)local_54 < iVar7) {
      arith_encode(cinfo,(uchar *)(p_Var14 + lVar12),0);
    }
    piVar13 = jpeg_natural_order + iVar7;
    p_Var14 = p_Var14 + lVar12 + 1;
    iVar11 = iVar7;
    do {
      uVar6 = (uint)(*paJVar3)[*piVar13];
      pjVar8 = pjVar2 + 0xf;
      if ((*paJVar3)[*piVar13] < 0) {
        uVar9 = -uVar6 >> ((byte)cinfo->Al & 0x1f);
        if ((short)uVar9 != 0) {
          if ((uVar9 & 0xffff) != 1) goto LAB_001119c0;
          arith_encode(cinfo,(uchar *)p_Var14,1);
          uVar9 = 1;
          goto LAB_001119cc;
        }
      }
      else {
        bVar4 = (byte)cinfo->Al & 0x1f;
        uVar9 = uVar6 >> bVar4;
        if (uVar6 >> bVar4 != 0) goto LAB_00111978;
      }
      arith_encode(cinfo,(uchar *)p_Var14,0);
      iVar11 = iVar11 + 1;
      piVar13 = piVar13 + 1;
      p_Var14 = p_Var14 + 3;
    } while( true );
  }
LAB_001119f5:
  if (iVar7 <= (int)uVar6) {
    arith_encode(cinfo,(uchar *)((&pjVar2[9].finish_pass)[iVar1] + (iVar7 * 3 + -3)),1);
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_AC_refine(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int tbl, k, ke, kex;
  int v;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      emit_restart(cinfo, entropy->next_restart_num);
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  /* Encode the MCU data block */
  block = MCU_data[0];
  tbl = cinfo->cur_comp_info[0]->ac_tbl_no;

  /* Section G.1.3.3: Encoding of AC coefficients */

  /* Establish EOB (end-of-block) index */
  for (ke = cinfo->Se; ke > 0; ke--)
    /* We must apply the point transform by Al.  For AC coefficients this
     * is an integer division with rounding towards 0.  To do this portably
     * in C, we shift after obtaining the absolute value.
     */
    if ((v = (*block)[jpeg_natural_order[ke]]) >= 0) {
      if (v >>= cinfo->Al) break;
    } else {
      v = -v;
      if (v >>= cinfo->Al) break;
    }

  /* Establish EOBx (previous stage end-of-block) index */
  for (kex = ke; kex > 0; kex--)
    if ((v = (*block)[jpeg_natural_order[kex]]) >= 0) {
      if (v >>= cinfo->Ah) break;
    } else {
      v = -v;
      if (v >>= cinfo->Ah) break;
    }

  /* Figure G.10: Encode_AC_Coefficients_SA */
  for (k = cinfo->Ss; k <= ke; k++) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    if (k > kex)
      arith_encode(cinfo, st, 0);       /* EOB decision */
    for (;;) {
      if ((v = (*block)[jpeg_natural_order[k]]) >= 0) {
        if (v >>= cinfo->Al) {
          if (v >> 1)                   /* previously nonzero coef */
            arith_encode(cinfo, st + 2, (v & 1));
          else {                        /* newly nonzero coef */
            arith_encode(cinfo, st + 1, 1);
            arith_encode(cinfo, entropy->fixed_bin, 0);
          }
          break;
        }
      } else {
        v = -v;
        if (v >>= cinfo->Al) {
          if (v >> 1)                   /* previously nonzero coef */
            arith_encode(cinfo, st + 2, (v & 1));
          else {                        /* newly nonzero coef */
            arith_encode(cinfo, st + 1, 1);
            arith_encode(cinfo, entropy->fixed_bin, 1);
          }
          break;
        }
      }
      arith_encode(cinfo, st + 1, 0);  st += 3;  k++;
    }
  }
  /* Encode EOB decision only if k <= cinfo->Se */
  if (k <= cinfo->Se) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    arith_encode(cinfo, st, 1);
  }

  return TRUE;
}